

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_addc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  uintptr_t o_2;
  DisasCompare_conflict2 cmp;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_add_i64(tcg_ctx,o->out,o->in1,o->in2);
  disas_jcc(s,&cmp,3);
  ret = tcg_temp_new_i64(tcg_ctx);
  if (cmp.is_64 == true) {
    tcg_gen_setcond_i64_s390x(tcg_ctx,(uint)(byte)cmp._0_1_,ret,cmp.u.s64.a,cmp.u.s64.b);
  }
  else {
    ret_00 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_setcond_i32_s390x(tcg_ctx,(uint)(byte)cmp._0_1_,ret_00,cmp.u.s32.a,cmp.u.s32.b);
    tcg_gen_extu_i32_i64_s390x(tcg_ctx,ret,ret_00);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  }
  free_compare(tcg_ctx,&cmp);
  tcg_gen_add_i64(tcg_ctx,o->out,o->out,ret);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_addc(DisasContext *s, DisasOps *o)
{
    DisasCompare cmp;
    TCGv_i64 carry;
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_add_i64(tcg_ctx, o->out, o->in1, o->in2);

    /* The carry flag is the msb of CC, therefore the branch mask that would
       create that comparison is 3.  Feeding the generated comparison to
       setcond produces the carry flag that we desire.  */
    disas_jcc(s, &cmp, 3);
    carry = tcg_temp_new_i64(tcg_ctx);
    if (cmp.is_64) {
        tcg_gen_setcond_i64(tcg_ctx, cmp.cond, carry, cmp.u.s64.a, cmp.u.s64.b);
    } else {
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_setcond_i32(tcg_ctx, cmp.cond, t, cmp.u.s32.a, cmp.u.s32.b);
        tcg_gen_extu_i32_i64(tcg_ctx, carry, t);
        tcg_temp_free_i32(tcg_ctx, t);
    }
    free_compare(tcg_ctx, &cmp);

    tcg_gen_add_i64(tcg_ctx, o->out, o->out, carry);
    tcg_temp_free_i64(tcg_ctx, carry);
    return DISAS_NEXT;
}